

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

void enet_protocol_change_state(ENetHost *host,ENetPeer *peer,ENetPeerState state)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = (int)host->peerCount - 5;
  if ((int)peer - 5U < 2) {
    if (uVar3 < 2) goto LAB_00108263;
    iVar1 = *(int *)&(host->dispatchQueue).sentinel.next;
    lVar2 = *(long *)((long)&(host->address).field_0 + 0xc);
    lVar4 = 1;
  }
  else {
    if (1 < uVar3) goto LAB_00108263;
    iVar1 = *(int *)&(host->dispatchQueue).sentinel.next;
    lVar2 = *(long *)((long)&(host->address).field_0 + 0xc);
    lVar4 = -1;
  }
  if (iVar1 != 0) {
    *(long *)(lVar2 + 0x2af0) = *(long *)(lVar2 + 0x2af0) + lVar4;
  }
  *(long *)(lVar2 + 0x2ae8) = *(long *)(lVar2 + 0x2ae8) + lVar4;
LAB_00108263:
  *(int *)&host->peerCount = (int)peer;
  return;
}

Assistant:

static void enet_protocol_change_state(ENetHost* host, ENetPeer* peer, ENetPeerState state) {
	if (state == ENET_PEER_STATE_CONNECTED || state == ENET_PEER_STATE_DISCONNECT_LATER)
		enet_peer_on_connect(peer);
	else
		enet_peer_on_disconnect(peer);

	peer->state = state;
}